

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::CreateInstance
          (ArenaStringPtr *this,Arena *arena,string *initial_value)

{
  string *in_RDX;
  type_info *in_RSI;
  undefined8 *in_RDI;
  size_t n;
  size_t in_stack_fffffffffffffec0;
  Arena *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  ArenaImpl *in_stack_fffffffffffffee0;
  undefined8 local_40;
  
  if (in_RSI == (type_info *)0x0) {
    local_40 = (string *)operator_new(0x20);
    std::__cxx11::string::string(local_40,in_RDX);
  }
  else {
    AlignUpTo8(0x20);
    Arena::AllocHook(in_stack_fffffffffffffed0,in_RSI,in_stack_fffffffffffffec0);
    local_40 = (string *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          (_func_void_void_ptr *)in_stack_fffffffffffffed0);
    std::__cxx11::string::string(local_40,in_RDX);
  }
  *in_RDI = local_40;
  return;
}

Assistant:

PROTOBUF_NOINLINE
  void CreateInstance(Arena* arena, const ::std::string* initial_value) {
    GOOGLE_DCHECK(initial_value != NULL);
    // uses "new ::std::string" when arena is nullptr
    ptr_ = Arena::Create< ::std::string>(arena, *initial_value);
  }